

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O3

int Saig_ManFindFailedPoCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  
  Aig_ManCleanMarkB(pAig);
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  if (pAig->nRegs < 1) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar4 = pAig->nTruePis + (int)uVar6;
      if (((int)uVar4 < 0) || (pAig->vCis->nSize <= (int)uVar4)) goto LAB_00656f7f;
      pvVar2 = pAig->vCis->pArray[uVar4];
      uVar4 = (int)uVar6 + 1;
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&p[1].iPo)[uVar6 >> 5] >> ((byte)uVar6 & 0x1f) & 1) << 5);
      uVar6 = (ulong)uVar4;
    } while ((int)uVar4 < pAig->nRegs);
  }
  if (-1 < p->iFrame) {
    iVar8 = 0;
    do {
      if (0 < pAig->nTruePis) {
        lVar10 = 0;
        do {
          if (pAig->vCis->nSize <= lVar10) goto LAB_00656f7f;
          pvVar2 = pAig->vCis->pArray[lVar10];
          *(ulong *)((long)pvVar2 + 0x18) =
               *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((uint)(&p[1].iPo)[(int)((ulong)uVar4 + lVar10) >> 5] >>
                        ((byte)((ulong)uVar4 + lVar10) & 0x1f) & 1) << 5);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pAig->nTruePis);
        uVar4 = uVar4 + (int)lVar10;
      }
      pVVar11 = pAig->vObjs;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          pvVar2 = pVVar11->pArray[lVar10];
          if ((pvVar2 != (void *)0x0) &&
             (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
            *(ulong *)((long)pvVar2 + 0x18) =
                 *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
            pVVar11 = pAig->vObjs;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar11->nSize);
      }
      pVVar11 = pAig->vCos;
      if (0 < pVVar11->nSize) {
        lVar10 = 0;
        do {
          pvVar2 = pVVar11->pArray[lVar10];
          *(ulong *)((long)pvVar2 + 0x18) =
               *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 5 ^
                       *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20
                      );
          lVar10 = lVar10 + 1;
          pVVar11 = pAig->vCos;
        } while (lVar10 < pVVar11->nSize);
      }
      iVar5 = p->iFrame;
      if (iVar8 == iVar5) break;
      if (0 < pAig->nRegs) {
        iVar5 = 0;
        do {
          uVar9 = pAig->nTruePos + iVar5;
          if (((((int)uVar9 < 0) || (pAig->vCos->nSize <= (int)uVar9)) ||
              (uVar12 = pAig->nTruePis + iVar5, (int)uVar12 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar12)) goto LAB_00656f7f;
          pvVar2 = pAig->vCis->pArray[uVar12];
          *(ulong *)((long)pvVar2 + 0x18) =
               *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
               (ulong)((uint)*(undefined8 *)((long)pAig->vCos->pArray[uVar9] + 0x18) & 0x20);
          iVar5 = iVar5 + 1;
        } while (iVar5 < pAig->nRegs);
        iVar5 = p->iFrame;
      }
      bVar3 = iVar8 < iVar5;
      iVar8 = iVar8 + 1;
    } while (bVar3);
  }
  if (uVar4 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigDup.c"
                  ,0x1c8,"int Saig_ManFindFailedPoCex(Aig_Man_t *, Abc_Cex_t *)");
  }
  iVar8 = -1;
  if (0 < (long)pAig->nTruePos) {
    uVar4 = pAig->vCos->nSize;
    uVar7 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar7;
    }
    do {
      if (uVar6 == uVar7) {
LAB_00656f7f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if ((*(byte *)((long)pAig->vCos->pArray[uVar7] + 0x18) & 0x20) != 0) {
        iVar8 = (int)uVar7;
        break;
      }
      uVar7 = uVar7 + 1;
    } while ((long)pAig->nTruePos != uVar7);
  }
  Aig_ManCleanMarkB(pAig);
  return iVar8;
}

Assistant:

int Saig_ManFindFailedPoCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == p->nBits );
    // remember the number of failed output
    RetValue = -1;
    Saig_ManForEachPo( pAig, pObj, i )
        if ( pObj->fMarkB )
        {
            RetValue = i;
            break;
        }
    Aig_ManCleanMarkB(pAig);
    return RetValue;
}